

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.cpp
# Opt level: O2

PMJ02BNSampler *
pbrt::PMJ02BNSampler::Create(ParameterDictionary *parameters,FileLoc *loc,Allocator alloc)

{
  int iVar1;
  int *piVar2;
  PMJ02BNSampler *pPVar3;
  int nsamp;
  allocator<char> local_39;
  Allocator alloc_local;
  string local_30;
  
  alloc_local = alloc;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"pixelsamples",&local_39);
  iVar1 = ParameterDictionary::GetOneInt(parameters,&local_30,0x10);
  std::__cxx11::string::~string((string *)&local_30);
  nsamp = iVar1;
  if (*(char *)(Options + 0x1c) == '\x01') {
    piVar2 = pstd::optional<int>::value((optional<int> *)(Options + 0x18));
    nsamp = *piVar2;
  }
  if (*(char *)(Options + 8) == '\x01') {
    nsamp = 1;
  }
  pPVar3 = pstd::pmr::polymorphic_allocator<std::byte>::
           new_object<pbrt::PMJ02BNSampler,int&,pstd::pmr::polymorphic_allocator<std::byte>&>
                     (&alloc_local,&nsamp,&alloc_local);
  return pPVar3;
}

Assistant:

PMJ02BNSampler *PMJ02BNSampler::Create(const ParameterDictionary &parameters,
                                       const FileLoc *loc, Allocator alloc) {
    int nsamp = parameters.GetOneInt("pixelsamples", 16);
    if (Options->pixelSamples)
        nsamp = *Options->pixelSamples;
    if (Options->quickRender)
        nsamp = 1;
    return alloc.new_object<PMJ02BNSampler>(nsamp, alloc);
}